

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CGL::Misc::draw_sphere(Vector3D *p,double r)

{
  ulong uVar1;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  Vector3D *n;
  Vector3D n3;
  Vector3D n2;
  Vector3D n1;
  double *vPtr3;
  double *vPtr2;
  double *vPtr1;
  int i;
  Vector3D *in_stack_fffffffffffffef8;
  Vector3D *in_stack_ffffffffffffff00;
  Vector3D *in_stack_ffffffffffffff18;
  undefined1 local_c8 [40];
  undefined1 *local_a0;
  Vector3D local_98;
  Vector3D local_78;
  Vector3D local_58;
  double *local_30;
  double *local_28;
  double *local_20;
  int local_14;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  if (!initialized) {
    init_mesh();
    initialized = true;
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated(*local_8,local_8[1],local_8[2]);
  glScaled(local_10,local_10,local_10);
  for (local_14 = 0; local_14 < 48000; local_14 = local_14 + 3) {
    glBegin(9);
    uVar1 = (ulong)(Indices[local_14] << 3);
    local_20 = Vertices + uVar1;
    local_28 = Vertices + (Indices[local_14 + 1] << 3);
    local_30 = Vertices + (Indices[local_14 + 2] << 3);
    Vector3D::Vector3D(&local_58,Vertices[uVar1 + 2],Vertices[uVar1 + 3],Vertices[uVar1 + 4]);
    Vector3D::Vector3D(&local_78,local_28[2],local_28[3],local_28[4]);
    Vector3D::Vector3D(&local_98,local_30[2],local_30[3],local_30[4]);
    Vector3D::operator+(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Vector3D::operator+(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Vector3D::unit(in_stack_ffffffffffffff18);
    local_a0 = local_c8;
    glNormal3dv(&local_58);
    glVertex3dv(local_20 + 5);
    glNormal3dv(&local_78);
    glVertex3dv(local_28 + 5);
    glNormal3dv(&local_98);
    glVertex3dv(local_30 + 5);
    glEnd();
  }
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere(const Vector3D& p, double r) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_POLYGON);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    Vector3D n1(vPtr1[NORMAL_OFFSET],
                vPtr1[NORMAL_OFFSET + 1],
                vPtr1[NORMAL_OFFSET + 2]);
    Vector3D n2(vPtr2[NORMAL_OFFSET],
                vPtr2[NORMAL_OFFSET + 1],
                vPtr2[NORMAL_OFFSET + 2]);
    Vector3D n3(vPtr3[NORMAL_OFFSET],
                vPtr3[NORMAL_OFFSET + 1],
                vPtr3[NORMAL_OFFSET + 2]);
    const Vector3D& n = (n1 + n2 + n3).unit();
    glNormal3dv(&n1.x);
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glNormal3dv(&n2.x);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glNormal3dv(&n3.x);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  /*
  TODO: when I use this scratch code to render the mesh using the more efficient
        glDrawElements, it works for a single frame and then fails on all
        successive frames. Any opengl experts care to figure out why?
  glEnableClientState(GL_NORMAL_ARRAY);
  glEnableClientState(GL_VERTEX_ARRAY);
  glEnable(GL_NORMALIZE);
  for (int i = 0; i < SPHERE_NUM_VERTICES; i++) {
    normals[3 * i] = Vertices[8 * i + 2];
    normals[3 * i + 1] = Vertices[8 * i + 3];
    normals[3 * i + 2] = Vertices[8 * i + 4];
    vertices[3 * i] = Vertices[8 * i + 5];
    vertices[3 * i + 1] = Vertices[8 * i + 6];
    vertices[3 * i + 2] = Vertices[8 * i + 7];
  }

  glVertexPointer(3, GL_DOUBLE, 0, vertices);
  glNormalPointer(GL_DOUBLE, 0, normals);
  glDrawElements(GL_TRIANGLES, SPHERE_NUM_INDICES, GL_UNSIGNED_INT, Indices);
  */

  glPopMatrix();
}